

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O2

void __thiscall cnn::LookupNode::accumulate_grad(LookupNode *this,Tensor *g)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  LookupParameters *this_01;
  const_reference pvVar1;
  uint uVar2;
  ulong __n;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_30;
  
  if (this->pindex != (uint *)0x0) {
    LookupParameters::accumulate_grad(this->params,*this->pindex,g);
    return;
  }
  if (this->pindices != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    Tensor::batch_elems(&local_30,g);
    uVar2 = 0;
    while( true ) {
      this_00 = this->pindices;
      __n = (ulong)uVar2;
      if ((ulong)((long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= __n) {
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_30);
        return;
      }
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,__n);
      this_01 = this->params;
      if ((ulong)(((long)(this_01->values).
                         super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this_01->values).
                        super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x48) <= (ulong)*pvVar1) break;
      LookupParameters::accumulate_grad
                (this_01,*pvVar1,
                 local_30.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                 super__Vector_impl_data._M_start + __n);
      uVar2 = uVar2 + 1;
    }
    __assert_fail("i < params->values.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/param-nodes.cc"
                  ,0xb0,"virtual void cnn::LookupNode::accumulate_grad(const Tensor &)");
  }
  __assert_fail("pindices",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/param-nodes.cc"
                ,0xac,"virtual void cnn::LookupNode::accumulate_grad(const Tensor &)");
}

Assistant:

void LookupNode::accumulate_grad(const Tensor& g) {
  if(pindex) {
    params->accumulate_grad(*pindex, g);
  } else {
    assert (pindices);
    const vector<Tensor>& gb = g.batch_elems();
    for (unsigned b = 0; b < pindices->size(); ++b) {
      unsigned i = pindices->at(b);
      assert (i < params->values.size());
      params->accumulate_grad(i, gb[b]);
    }
  }
}